

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

int launch_obj(short otyp,int x1,int y1,int x2,int y2,int style)

{
  undefined1 *puVar1;
  char cVar2;
  monst *mtmp;
  trap *ptVar3;
  int iVar4;
  boolean bVar5;
  schar sVar6;
  int iVar7;
  int iVar8;
  obj *poVar9;
  obj *obj;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar10;
  trap *ptVar11;
  long lVar12;
  trap *ptVar13;
  uint uVar14;
  trap *__ptr;
  ulong uVar15;
  undefined6 in_register_0000003a;
  char *pcVar16;
  ulong uVar17;
  int iVar18;
  d_level dest;
  obj *local_78;
  int local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  undefined8 local_60;
  ulong local_58;
  undefined8 local_50;
  d_level local_42;
  obj *local_40;
  obj *local_38;
  
  local_58 = CONCAT44(local_58._4_4_,y2);
  iVar18 = (int)CONCAT62(in_register_0000003a,otyp);
  poVar9 = sobj_at(0x214,level,iVar18,x1);
  iVar8 = x1;
  iVar7 = iVar18;
  local_70 = y1;
  local_6c = x2;
  if ((poVar9 == (obj *)0x0) &&
     (poVar9 = sobj_at(0x214,level,y1,x2), iVar8 = x2, iVar7 = y1, local_70 = iVar18, local_6c = x1,
     poVar9 == (obj *)0x0)) {
    return 0;
  }
  if (poVar9->quan == 1) {
    obj_extract_self(poVar9);
    obj = poVar9;
    poVar9 = (obj *)0x0;
  }
  else {
    obj = splitobj(poVar9,1);
    obj_extract_self(obj);
  }
  local_78 = obj;
  local_38 = poVar9;
  newsym(iVar7,iVar8);
  iVar4 = local_6c;
  iVar18 = local_70;
  if ((obj->ox == digging.pos.x) && (obj->oy == digging.pos.y)) {
    digging.effort = 0;
    digging.lastdigtime = 0;
    digging.level.dnum = '\0';
    digging.level.dlevel = '\0';
    digging.pos.x = '\0';
    digging.pos.y = '\0';
    digging.down = '\0';
    digging.chew = '\0';
    digging.warned = '\0';
    digging.quiet = '\0';
  }
  local_40 = obj;
  local_68 = distmin(iVar7,iVar8,local_70,local_6c);
  poVar9 = local_40;
  bhitpos.x = (xchar)iVar7;
  bhitpos.y = (xchar)iVar8;
  iVar7 = sgn(iVar18 - iVar7);
  local_60 = CONCAT44(extraout_var,iVar7);
  iVar8 = sgn(iVar4 - iVar8);
  local_50 = CONCAT44(extraout_var_00,iVar8);
  if ((int)local_58 == 1) {
LAB_002691ad:
    local_64 = 2;
    iVar8 = 1;
  }
  else {
    if ((int)local_58 == 0x81) {
      puVar1 = &poVar9->field_0x4b;
      *puVar1 = *puVar1 | 0x80;
      goto LAB_002691ad;
    }
    local_64 = 1;
    iVar8 = (int)local_58;
    if ((int)local_58 == 0x41) {
      pcVar16 = "rumbling in the distance.";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar16 = "someone bowling.";
        }
        else {
          bVar5 = dmgtype(youmonst.data,0x24);
          pcVar16 = "rumbling in the distance.";
          if (bVar5 == '\0') {
            pcVar16 = "someone bowling.";
          }
        }
      }
      You_hear(pcVar16);
      goto LAB_002691ad;
    }
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    flush_screen();
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0')))) {
    iVar7 = (int)poVar9->otyp;
  }
  else {
    iVar7 = display_rng(0x219);
    iVar7 = iVar7 + 1;
  }
  tmp_at(-4,iVar7 + 1);
  tmp_at((int)bhitpos.x,(int)bhitpos.y);
  if ((int)local_68 < 1) {
LAB_0026977f:
    tmp_at(-6,0);
    iVar7 = local_6c;
    iVar8 = local_70;
    *(uint *)&local_78->field_0x4a = *(uint *)&local_78->field_0x4a & 0xffff7fff;
    place_object(local_78,level,local_70,local_6c);
    newsym(iVar8,iVar7);
    return 1;
  }
  local_64 = local_64 + 1;
LAB_00269267:
  local_58 = (ulong)local_68;
  tmp_at((int)bhitpos.x,(int)bhitpos.y);
  uVar14 = local_64;
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
    do {
      (*windowprocs.win_delay)();
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
  }
  bhitpos.x = bhitpos.x + (char)local_60;
  bhitpos.y = bhitpos.y + (char)local_50;
  for (__ptr = level->lev_traps; __ptr != (trap *)0x0; __ptr = __ptr->ntrap) {
    if ((__ptr->tx == bhitpos.x) && (__ptr->ty == bhitpos.y)) goto LAB_002692e5;
  }
  __ptr = (trap *)0x0;
LAB_002692e5:
  local_68 = (int)local_58 - 1;
  mtmp = level->monsters[bhitpos.x][bhitpos.y];
  if ((mtmp == (monst *)0x0) || ((mtmp->field_0x61 & 2) != 0)) {
    if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) {
      if (multi != 0) {
        nomul(0,(char *)0x0);
      }
      cVar2 = local_78->spe;
      iVar7 = dmgval((monst *)0x0,local_78,'\x01',&youmonst);
      iVar7 = thitu(cVar2 + 9,iVar7,local_78,(obj *)0x0,(monst *)0x0,(char *)0x0);
      if (iVar7 != 0) {
        stop_occupation();
      }
    }
  }
  else {
    if (((mtmp->data->mflags2 & 0x8000000) != 0) &&
       (uVar14 = mt_random(), 0x55555555 < uVar14 * -0x55555555)) {
      pcVar16 = Monnam(mtmp);
      pline("%s snatches the boulder.",pcVar16);
      *(uint *)&local_78->field_0x4a = *(uint *)&local_78->field_0x4a & 0xffff7fff;
      mpickobj(mtmp,local_78);
      goto LAB_00269963;
    }
    uVar14 = local_68;
    if (iVar8 == 1) {
      uVar14 = 0xffffffff;
    }
    iVar7 = ohitmon((monst *)0x0,mtmp,local_78,local_38,uVar14,'\0');
    if (iVar7 != 0) goto LAB_00269963;
  }
  if (iVar8 == 1) {
    sVar6 = down_gate(bhitpos.x,bhitpos.y);
    if ((sVar6 != -1) && (bVar5 = ship_object(local_78,bhitpos.x,bhitpos.y,'\0'), bVar5 != '\0'))
    goto LAB_00269963;
    if (__ptr != (trap *)0x0) {
      uVar14 = (byte)__ptr->field_0x8 & 0x1f;
      if (uVar14 - 0x10 < 2) {
        if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
          You_hear("a rumbling stop abruptly.");
        }
        else {
          pline("Suddenly the rolling boulder disappears!");
        }
        *(uint *)&local_78->field_0x4a = *(uint *)&local_78->field_0x4a & 0xffff7fff;
        if ((__ptr->field_0x8 & 0x1f) == 0x10) {
          rloco(local_78);
LAB_002698bd:
          if ((__ptr->field_0x8 & 0x20) != 0) goto LAB_00269963;
          __ptr->field_0x8 = __ptr->field_0x8 | 0x20;
          uVar17 = (ulong)(uint)(int)__ptr->tx;
          uVar15 = (ulong)(uint)(int)__ptr->ty;
          goto LAB_0026995e;
        }
        iVar7 = random_teleport_level();
        sVar6 = depth(&u.uz);
        if ((iVar7 != sVar6) && (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) {
          get_level(&local_42,iVar7);
          deliver_object(local_78,local_42.dnum,local_42.dlevel,0);
          goto LAB_002698bd;
        }
        goto LAB_0026976d;
      }
      if (uVar14 != 6) {
        if (3 < uVar14 - 0xb) goto LAB_002694a7;
        local_70 = (int)bhitpos.x;
        local_6c = (int)bhitpos.y;
        bVar5 = flooreffects(local_78,local_70,local_6c,"fall");
        if (bVar5 != '\0') goto LAB_00269963;
        goto LAB_0026977f;
      }
      uVar14 = mt_random();
      if (2 < uVar14 % 10) {
        pcVar16 = " The rolling boulder triggers a land mine.";
        if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
          pcVar16 = "";
        }
        pline("KAABLAMM!!!%s",pcVar16);
        ptVar3 = level->lev_traps;
        if (ptVar3 == __ptr) {
          ptVar11 = (trap *)&level->lev_traps;
          ptVar13 = ptVar3;
        }
        else {
          do {
            ptVar11 = ptVar3;
            ptVar13 = __ptr;
            ptVar3 = ptVar11->ntrap;
          } while (ptVar11->ntrap != __ptr);
        }
        ptVar11->ntrap = ptVar13->ntrap;
        free(__ptr);
        del_engr_at(level,(int)bhitpos.x,(int)bhitpos.y);
        place_object(local_78,level,(int)bhitpos.x,(int)bhitpos.y);
        *(uint *)&local_78->field_0x4a = *(uint *)&local_78->field_0x4a & 0xffff7fff;
        fracture_rock(local_78);
        scatter((int)bhitpos.x,(int)bhitpos.y,4,0x1f,(obj *)0x0);
        uVar15 = (ulong)bhitpos.y;
        uVar17 = (ulong)bhitpos.x;
        if ((viz_array[uVar15][uVar17] & 2U) != 0) {
LAB_0026995e:
          newsym((int)uVar17,(int)uVar15);
        }
LAB_00269963:
        tmp_at(-6,0);
        return 2;
      }
    }
LAB_002694a7:
    bVar5 = flooreffects(local_78,(int)bhitpos.x,(int)bhitpos.y,"fall");
    if (bVar5 == '\0') {
      poVar9 = sobj_at(0x214,level,(int)bhitpos.x,(int)bhitpos.y);
      if (poVar9 == (obj *)0x0) goto LAB_002695d6;
      if (((int)local_60 + (int)bhitpos.x) - 1U < 0x4f) {
        uVar14 = bhitpos.y + (int)local_50;
        if ((((int)uVar14 < 0) || (local_68 == 0 || 0x14 < uVar14)) ||
           (pcVar16 = " as one boulder sets another in motion",
           level->locations[(uint)((int)bhitpos.x + (int)local_60)][uVar14].typ < '\x11'))
        goto LAB_00269549;
      }
      else {
LAB_00269549:
        pcVar16 = " as one boulder hits another";
      }
      if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
        pcVar16 = "";
      }
      You_hear("a loud crash%s!",pcVar16);
      obj_extract_self(poVar9);
      *(uint *)&poVar9->field_0x4a =
           *(uint *)&poVar9->field_0x4a & 0xffff7fff | *(uint *)&local_78->field_0x4a & 0x8000;
      local_78->field_0x4b = local_78->field_0x4b & 0x7f;
      place_object(local_78,level,(int)bhitpos.x,(int)bhitpos.y);
      local_78 = poVar9;
      wake_nearto((int)bhitpos.x,(int)bhitpos.y,100);
      goto LAB_002695d6;
    }
    goto LAB_00269963;
  }
LAB_002695d6:
  bVar5 = closed_door(level,(int)bhitpos.x,(int)bhitpos.y);
  if (bVar5 == '\0') {
    if ((int)local_58 == 1) goto LAB_0026977f;
  }
  else {
    lVar10 = (long)bhitpos.y;
    lVar12 = (long)bhitpos.x;
    if ((viz_array[lVar10][lVar12] & 2U) != 0) {
      pline("The boulder crashes through a door.");
      lVar12 = (long)bhitpos.x;
      lVar10 = (long)bhitpos.y;
    }
    *(uint *)&level->locations[lVar12][lVar10].field_0x6 =
         *(uint *)&level->locations[lVar12][lVar10].field_0x6 & 0xfffffe0f | 0x10;
    if (local_68 == 0) goto LAB_0026977f;
    unblock_point((int)bhitpos.x,(int)bhitpos.y);
  }
  iVar7 = (int)bhitpos.x;
  if (((int)local_60 + iVar7) - 1U < 0x4f) {
    iVar18 = (int)bhitpos.y;
    uVar14 = (int)local_50 + iVar18;
    if ((uVar14 < 0x15) && (level->locations[(uint)((int)local_60 + iVar7)][uVar14].typ == '\x16'))
    {
      uVar14 = mt_random();
      bVar5 = hits_bars(&local_78,iVar7,iVar18,(int)local_60,(int)local_50,
                        (uint)((uVar14 * -0x33333333 >> 2 | uVar14 * 0x40000000) < 0xccccccd),0);
      local_70 = iVar7;
      local_6c = iVar18;
      if (bVar5 != '\0') {
        if (local_78 == (obj *)0x0) goto LAB_00269963;
        goto LAB_0026977f;
      }
    }
  }
LAB_0026976d:
  if ((int)local_58 < 2) goto LAB_0026977f;
  goto LAB_00269267;
}

Assistant:

int launch_obj(short otyp, int x1, int y1, int x2, int y2, int style)
{
	struct monst *mtmp;
	struct obj *otmp, *otmp2;
	int dx, dy;
	struct obj *singleobj, *ostack;
	boolean used_up = FALSE;
	boolean otherside = FALSE;
	int dist;
	int tmp;
	int delaycnt = 0;

	otmp = sobj_at(otyp, level, x1, y1);
	/* Try the other side too, for rolling boulder traps */
	if (!otmp && otyp == BOULDER) {
		otherside = TRUE;
		otmp = sobj_at(otyp, level, x2, y2);
	}
	if (!otmp) return 0;
	if (otherside) {	/* swap 'em */
		int tx, ty;

		tx = x1; ty = y1;
		x1 = x2; y1 = y2;
		x2 = tx; y2 = ty;
	}

	if (otmp->quan == 1L) {
	    ostack = NULL;
	    obj_extract_self(otmp);
	    singleobj = otmp;
	    otmp = NULL;
	} else {
	    ostack = otmp;
	    singleobj = splitobj(otmp, 1L);
	    obj_extract_self(singleobj);
	}
	newsym(x1,y1);
	/* in case you're using a pick-axe to chop the boulder that's being
	   launched (perhaps a monster triggered it), destroy context so that
	   next dig attempt never thinks you're resuming previous effort */
	if ((otyp == BOULDER || otyp == STATUE) &&
	    singleobj->ox == digging.pos.x && singleobj->oy == digging.pos.y)
	    memset(&digging, 0, sizeof digging);

	dist = distmin(x1,y1,x2,y2);
	bhitpos.x = x1;
	bhitpos.y = y1;
	dx = sgn(x2 - x1);
	dy = sgn(y2 - y1);
	switch (style) {
	    case ROLL|LAUNCH_UNSEEN:
			if (otyp == BOULDER) {
			    You_hear(Hallucination ?
				     "someone bowling." :
				     "rumbling in the distance.");
			}
			style &= ~LAUNCH_UNSEEN;
			goto roll;
	    case ROLL|LAUNCH_KNOWN:
			/* use otrapped as a flag to ohitmon */
			singleobj->otrapped = 1;
			style &= ~LAUNCH_KNOWN;
			/* fall through */
	    roll:
	    case ROLL:
			delaycnt = 2;
			/* fall through */
	    default:
			if (!delaycnt)
			    delaycnt = 1;
			if (!cansee(bhitpos.x,bhitpos.y))
			    flush_screen();
			
			tmp_at(DISP_OBJECT, dbuf_objid(singleobj));
			tmp_at(bhitpos.x, bhitpos.y);
	}

	/* Set the object in motion */
	while (dist-- > 0 && !used_up) {
		struct trap *t;
		tmp_at(bhitpos.x, bhitpos.y);
		tmp = delaycnt;

		/* dstage@u.washington.edu -- Delay only if hero sees it */
		if (cansee(bhitpos.x, bhitpos.y))
			while (tmp-- > 0) win_delay_output();

		bhitpos.x += dx;
		bhitpos.y += dy;
		t = t_at(level, bhitpos.x, bhitpos.y);
		
		if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
			if (otyp == BOULDER && throws_rocks(mtmp->data)) {
			    if (rn2(3)) {
				pline("%s snatches the boulder.",
					Monnam(mtmp));
				singleobj->otrapped = 0;
				mpickobj(mtmp, singleobj);
				used_up = TRUE;
				break;
			    }
			}
			if (ohitmon(NULL, mtmp, singleobj, ostack,
					(style==ROLL) ? -1 : dist, FALSE)) {
				used_up = TRUE;
				break;
			}
		} else if (bhitpos.x == u.ux && bhitpos.y == u.uy) {
			if (multi) nomul(0, NULL);
			if (thitu(9 + singleobj->spe,
				  dmgval(NULL, singleobj, TRUE, &youmonst),
				  singleobj, NULL, NULL, NULL)) {
			    stop_occupation();
			}
		}
		if (style == ROLL) {
		    if (down_gate(bhitpos.x, bhitpos.y) != -1) {
		        if (ship_object(singleobj, bhitpos.x, bhitpos.y, FALSE)){
				used_up = TRUE;
				break;
			}
		    }
		    if (t && otyp == BOULDER) {
			switch(t->ttyp) {
			case LANDMINE:
			    if (rn2(10) > 2) {
			  	pline(
				  "KAABLAMM!!!%s",
				  cansee(bhitpos.x, bhitpos.y) ?
					" The rolling boulder triggers a land mine." : "");
				deltrap(level, t);
				del_engr_at(level, bhitpos.x,bhitpos.y);
				place_object(singleobj, level, bhitpos.x, bhitpos.y);
				singleobj->otrapped = 0;
				fracture_rock(singleobj);
				scatter(bhitpos.x,bhitpos.y, 4,
					MAY_DESTROY|MAY_HIT|MAY_FRACTURE|VIS_EFFECTS,
					NULL);
				if (cansee(bhitpos.x,bhitpos.y))
					newsym(bhitpos.x,bhitpos.y);
			        used_up = TRUE;
			    }
			    break;		
			case LEVEL_TELEP:
			case TELEP_TRAP:
			    if (cansee(bhitpos.x, bhitpos.y))
			    	pline("Suddenly the rolling boulder disappears!");
			    else
			    	You_hear("a rumbling stop abruptly.");
			    singleobj->otrapped = 0;
			    if (t->ttyp == TELEP_TRAP)
				rloco(singleobj);
			    else {
				int newlev = random_teleport_level();
				d_level dest;

				if (newlev == depth(&u.uz) || In_endgame(&u.uz))
				    continue;
				get_level(&dest, newlev);
				deliver_object(singleobj, dest.dnum, dest.dlevel,
					       MIGR_RANDOM);
			    }
			    seetrap(t);
			    used_up = TRUE;
			    break;
			case PIT:
			case SPIKED_PIT:
			case HOLE:
			case TRAPDOOR:
			    /* the boulder won't be used up if there is a
			       monster in the trap; stop rolling anyway */
			    x2 = bhitpos.x,  y2 = bhitpos.y;  /* stops here */
			    if (flooreffects(singleobj, x2, y2, "fall"))
				used_up = TRUE;
			    dist = -1;	/* stop rolling immediately */
			    break;
			}
			if (used_up || dist == -1) break;
		    }
		    if (flooreffects(singleobj, bhitpos.x, bhitpos.y, "fall")) {
			used_up = TRUE;
			break;
		    }
		    if (otyp == BOULDER &&
		       (otmp2 = sobj_at(BOULDER, level, bhitpos.x, bhitpos.y)) != 0) {
			const char *bmsg =
				     " as one boulder sets another in motion";

			if (!isok(bhitpos.x + dx, bhitpos.y + dy) || !dist ||
			    IS_ROCK(level->locations[bhitpos.x + dx][bhitpos.y + dy].typ))
			    bmsg = " as one boulder hits another";

			You_hear("a loud crash%s!",
				cansee(bhitpos.x, bhitpos.y) ? bmsg : "");
			obj_extract_self(otmp2);
			/* pass off the otrapped flag to the next boulder */
			otmp2->otrapped = singleobj->otrapped;
			singleobj->otrapped = 0;
			place_object(singleobj, level, bhitpos.x, bhitpos.y);
			singleobj = otmp2;
			otmp2 = NULL;
			wake_nearto(bhitpos.x, bhitpos.y, 10*10);
		    }
		}
		if (otyp == BOULDER && closed_door(level, bhitpos.x,bhitpos.y)) {
			if (cansee(bhitpos.x, bhitpos.y))
				pline("The boulder crashes through a door.");
			level->locations[bhitpos.x][bhitpos.y].doormask = D_BROKEN;
			if (dist) unblock_point(bhitpos.x, bhitpos.y);
		}

		/* if about to hit iron bars, do so now */
		if (dist > 0 && isok(bhitpos.x + dx,bhitpos.y + dy) &&
			level->locations[bhitpos.x + dx][bhitpos.y + dy].typ == IRONBARS) {
		    x2 = bhitpos.x,  y2 = bhitpos.y;	/* object stops here */
		    if (hits_bars(&singleobj, x2, y2, dx, dy, !rn2(20), 0)) {
			if (!singleobj) used_up = TRUE;
			break;
		    }
		}
	}
	tmp_at(DISP_END, 0);
	if (!used_up) {
		singleobj->otrapped = 0;
		place_object(singleobj, level, x2,y2);
		newsym(x2,y2);
		return 1;
	} else
		return 2;
}